

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void breakstat(LexState *ls)

{
  FuncState *fs;
  byte bVar1;
  int l2;
  BlockCnt *pBVar2;
  
  fs = ls->fs;
  pBVar2 = (BlockCnt *)&fs->bl;
  bVar1 = 0;
  while( true ) {
    pBVar2 = pBVar2->previous;
    if (pBVar2 == (BlockCnt *)0x0) {
      luaX_syntaxerror(ls,"no loop to break");
    }
    if (pBVar2->isbreakable != '\0') break;
    bVar1 = bVar1 | pBVar2->upval;
  }
  if (bVar1 != 0) {
    luaK_codeABC(fs,OP_CLOSE,(uint)pBVar2->nactvar,0,0);
  }
  l2 = luaK_jump(fs);
  luaK_concat(fs,&pBVar2->breaklist,l2);
  return;
}

Assistant:

static void breakstat(LexState*ls){
FuncState*fs=ls->fs;
BlockCnt*bl=fs->bl;
int upval=0;
while(bl&&!bl->isbreakable){
upval|=bl->upval;
bl=bl->previous;
}
if(!bl)
luaX_syntaxerror(ls,"no loop to break");
if(upval)
luaK_codeABC(fs,OP_CLOSE,bl->nactvar,0,0);
luaK_concat(fs,&bl->breaklist,luaK_jump(fs));
}